

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

void gost_magma_encrypt_wrap(uchar *in,uchar *out,ossl_gost_cipher_ctx *c)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [11];
  undefined1 auVar18 [12];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uchar d [8];
  uchar b [8];
  ulong local_20;
  undefined8 local_18;
  ulong uVar33;
  
  uVar33 = *(ulong *)in;
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar33;
  auVar9[0xe] = (char)(uVar33 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar33;
  auVar10[0xc] = (char)(uVar33 >> 0x30);
  auVar10._13_2_ = auVar9._13_2_;
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar33;
  auVar11._12_3_ = auVar10._12_3_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar33;
  auVar12[10] = (char)(uVar33 >> 0x28);
  auVar12._11_4_ = auVar11._11_4_;
  auVar13._8_2_ = 0;
  auVar13._0_8_ = uVar33;
  auVar13._10_5_ = auVar12._10_5_;
  auVar14[8] = (char)(uVar33 >> 0x20);
  auVar14._0_8_ = uVar33;
  auVar14._9_6_ = auVar13._9_6_;
  auVar29[7] = 0;
  auVar29._0_7_ = auVar14._8_7_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar14._8_7_;
  auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar19[0] = (char)(uVar33 >> 0x18);
  auVar19._9_6_ = 0;
  auVar17._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar17[0] = (char)(uVar33 >> 0x10);
  auVar20._11_4_ = 0;
  auVar20._0_11_ = auVar17;
  auVar15._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar15[2] = (char)(uVar33 >> 8);
  auVar15[1] = 0;
  auVar15[0] = (byte)uVar33;
  auVar29._8_4_ = auVar15._0_4_;
  auVar29._12_4_ = auVar17._0_4_;
  auVar30 = pshuflw(auVar29,auVar29,0x1b);
  auVar30 = pshufhw(auVar30,auVar30,0x1b);
  sVar1 = auVar30._0_2_;
  sVar2 = auVar30._2_2_;
  sVar3 = auVar30._4_2_;
  sVar4 = auVar30._6_2_;
  sVar5 = auVar30._8_2_;
  sVar6 = auVar30._10_2_;
  sVar7 = auVar30._12_2_;
  sVar8 = auVar30._14_2_;
  local_18 = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar30[0xe] - (0xff < sVar8),
                      CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar30[0xc] - (0xff < sVar7),
                               CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar30[10] - (0xff < sVar6)
                                        ,CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar30[8] -
                                                  (0xff < sVar5),
                                                  CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                           auVar30[6] - (0xff < sVar4),
                                                           CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                    auVar30[4] - (0xff < sVar3),
                                                                    CONCAT11((0 < sVar2) *
                                                                             (sVar2 < 0x100) *
                                                                             auVar30[2] -
                                                                             (0xff < sVar2),
                                                                             (0 < sVar1) *
                                                                             (sVar1 < 0x100) *
                                                                             auVar30[0] -
                                                                             (0xff < sVar1))))))));
  gostcrypt(&c->cctx,(byte *)&local_18,(byte *)&local_20);
  auVar21._8_6_ = 0;
  auVar21._0_8_ = local_20;
  auVar21[0xe] = (char)(local_20 >> 0x38);
  auVar24._8_4_ = 0;
  auVar24._0_8_ = local_20;
  auVar24[0xc] = (char)(local_20 >> 0x30);
  auVar24._13_2_ = auVar21._13_2_;
  auVar25._8_4_ = 0;
  auVar25._0_8_ = local_20;
  auVar25._12_3_ = auVar24._12_3_;
  auVar26._8_2_ = 0;
  auVar26._0_8_ = local_20;
  auVar26[10] = (char)(local_20 >> 0x28);
  auVar26._11_4_ = auVar25._11_4_;
  auVar27._8_2_ = 0;
  auVar27._0_8_ = local_20;
  auVar27._10_5_ = auVar26._10_5_;
  auVar28[8] = (char)(local_20 >> 0x20);
  auVar28._0_8_ = local_20;
  auVar28._9_6_ = auVar27._9_6_;
  uVar33 = CONCAT17(0,auVar28._8_7_);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar33;
  auVar22._1_9_ = SUB169(auVar23 << 0x40,7);
  auVar22[0] = (char)(local_20 >> 0x18);
  auVar22._10_6_ = 0;
  auVar18._1_11_ = SUB1611(auVar22 << 0x30,5);
  auVar18[0] = (char)(local_20 >> 0x10);
  auVar30._12_4_ = 0;
  auVar30._0_12_ = auVar18;
  auVar31._3_13_ = SUB1613(auVar30 << 0x20,3);
  auVar31[2] = (char)(local_20 >> 8);
  auVar31[0] = (byte)local_20;
  auVar31[1] = 0;
  auVar32._8_4_ = auVar31._0_4_;
  auVar32._0_8_ = uVar33;
  auVar32._12_4_ = auVar18._0_4_;
  auVar30 = pshuflw(auVar32,auVar32,0x1b);
  auVar30 = pshufhw(auVar30,auVar30,0x1b);
  sVar1 = auVar30._0_2_;
  sVar2 = auVar30._2_2_;
  sVar3 = auVar30._4_2_;
  sVar4 = auVar30._6_2_;
  sVar5 = auVar30._8_2_;
  sVar6 = auVar30._10_2_;
  sVar7 = auVar30._12_2_;
  sVar8 = auVar30._14_2_;
  *(ulong *)out =
       CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar30[0xe] - (0xff < sVar8),
                CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar30[0xc] - (0xff < sVar7),
                         CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar30[10] - (0xff < sVar6),
                                  CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar30[8] -
                                           (0xff < sVar5),
                                           CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar30[6] -
                                                    (0xff < sVar4),
                                                    CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                             auVar30[4] - (0xff < sVar3),
                                                             CONCAT11((0 < sVar2) * (sVar2 < 0x100)
                                                                      * auVar30[2] - (0xff < sVar2),
                                                                      (0 < sVar1) * (sVar1 < 0x100)
                                                                      * auVar30[0] - (0xff < sVar1))
                                                            ))))));
  return;
}

Assistant:

void gost_magma_encrypt_wrap(unsigned char *in, unsigned char *out,
                   struct ossl_gost_cipher_ctx *c) {
    int i;
    unsigned char b[8];
    unsigned char d[8];
    for (i = 0; i < 8; i++) {
        b[7 - i] = in[i];
    }
    gostcrypt(&(c->cctx), b, d);
    for (i = 0; i < 8; i++) {
        out[7 - i] = d[i];
    }
}